

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDec.c
# Opt level: O3

char * Abc_FileRead(char *pFileName)

{
  FILE *__stream;
  long lVar1;
  char *__ptr;
  long lVar2;
  
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    __ptr = (char *)0x0;
    printf("Cannot open file \"%s\" for reading.\n",pFileName);
  }
  else {
    fseek(__stream,0,2);
    lVar1 = ftell(__stream);
    rewind(__stream);
    lVar2 = lVar1 << 0x20;
    __ptr = (char *)malloc(lVar2 + 0x300000000 >> 0x20);
    fread(__ptr,(long)(int)lVar1,1,__stream);
    __ptr[(int)lVar1] = '\n';
    __ptr[lVar2 + 0x100000000 >> 0x20] = '\n';
    __ptr[lVar2 + 0x200000000 >> 0x20] = '\0';
    fclose(__stream);
  }
  return __ptr;
}

Assistant:

char * Abc_FileRead( char * pFileName )
{
    FILE * pFile;
    char * pBuffer;
    int nFileSize, RetValue;
    pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\" for reading.\n", pFileName );
        return NULL;
    }
    // get the file size, in bytes
    fseek( pFile, 0, SEEK_END );  
    nFileSize = ftell( pFile );  
    // move the file current reading position to the beginning
    rewind( pFile ); 
    // load the contents of the file into memory
    pBuffer = (char *)malloc( nFileSize + 3 );
    RetValue = fread( pBuffer, nFileSize, 1, pFile );
    // add several empty lines at the end
    // (these will be used to signal the end of parsing)
    pBuffer[ nFileSize + 0] = '\n';
    pBuffer[ nFileSize + 1] = '\n';
    // terminate the string with '\0'
    pBuffer[ nFileSize + 2] = '\0';
    fclose( pFile );
    return pBuffer;
}